

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

size_t dgrminer::support<std::vector<int,std::allocator<int>>>
                 (vector<int,_std::allocator<int>_> *occurrences,
                 unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                 *multiple_occurrences,bool new_measures,bool heuristic_mis)

{
  bool bVar1;
  int iVar2;
  reference __k;
  mapped_type *pmVar3;
  pointer psVar4;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  reference psVar5;
  mapped_type *pmVar6;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> __result;
  undefined1 local_170 [8];
  set<int,_std::less<int>,_std::allocator<int>_> intersect;
  _Self local_130;
  _Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> secondOccurrence;
  _Self local_120;
  iterator firstOccurrence;
  set<int,_std::less<int>,_std::allocator<int>_> *occurrence;
  iterator __end0_1;
  iterator __begin0_1;
  mapped_type *__range4;
  map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
  mapping;
  OverlapGraph og;
  int *snapshotId;
  const_iterator __end0;
  const_iterator __begin0;
  vector<int,_std::allocator<int>_> *__range3;
  size_t support;
  bool heuristic_mis_local;
  bool new_measures_local;
  unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  *multiple_occurrences_local;
  vector<int,_std::allocator<int>_> *occurrences_local;
  
  if (new_measures) {
    __range3 = (vector<int,_std::allocator<int>_> *)0x0;
    __end0 = std::vector<int,_std::allocator<int>_>::begin(occurrences);
    snapshotId = (int *)std::vector<int,_std::allocator<int>_>::end(occurrences);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&snapshotId);
      if (!bVar1) break;
      __k = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator*(&__end0);
      OverlapGraph::OverlapGraph
                ((OverlapGraph *)&mapping._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 heuristic_mis);
      std::
      map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
      ::map((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
             *)&__range4);
      pmVar3 = std::
               unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
               ::at(multiple_occurrences,__k);
      __end0_1 = std::
                 set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ::begin(pmVar3);
      occurrence = (set<int,_std::less<int>,_std::allocator<int>_> *)
                   std::
                   set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   ::end(pmVar3);
      while( true ) {
        bVar1 = std::operator!=(&__end0_1,(_Self *)&occurrence);
        if (!bVar1) break;
        firstOccurrence._M_node =
             (_Base_ptr)
             std::_Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
             operator*(&__end0_1);
        iVar2 = OverlapGraph::addVertex
                          ((OverlapGraph *)&mapping._M_t._M_impl.super__Rb_tree_header._M_node_count
                          );
        pmVar6 = std::
                 map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                 ::operator[]((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                               *)&__range4,(key_type *)firstOccurrence._M_node);
        *pmVar6 = iVar2;
        std::_Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
        operator++(&__end0_1);
      }
      pmVar3 = std::
               unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
               ::at(multiple_occurrences,__k);
      local_120._M_node =
           (_Base_ptr)
           std::
           set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
           ::begin(pmVar3);
      while( true ) {
        pmVar3 = std::
                 unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                 ::at(multiple_occurrences,__k);
        secondOccurrence._M_node =
             (_Base_ptr)
             std::
             set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::end(pmVar3);
        bVar1 = std::operator!=(&local_120,&secondOccurrence);
        if (!bVar1) break;
        local_130._M_node =
             (_Base_ptr)
             std::
             next<std::_Rb_tree_const_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                       (local_120._M_node,1);
        while( true ) {
          pmVar3 = std::
                   unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                   ::at(multiple_occurrences,__k);
          intersect._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)std::
                       set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ::end(pmVar3);
          bVar1 = std::operator!=(&local_130,
                                  (_Self *)&intersect._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count);
          if (!bVar1) break;
          std::set<int,_std::less<int>,_std::allocator<int>_>::set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_170);
          psVar4 = std::
                   _Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
                   operator->(&local_120);
          __first1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(psVar4);
          psVar4 = std::
                   _Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
                   operator->(&local_120);
          __last1 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(psVar4);
          psVar4 = std::
                   _Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
                   operator->(&local_130);
          __first2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(psVar4);
          psVar4 = std::
                   _Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
                   operator->(&local_130);
          __last2 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(psVar4);
          __i = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_170);
          __result = std::inserter<std::set<int,std::less<int>,std::allocator<int>>>
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)local_170,__i);
          std::
          set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                    ((_Rb_tree_const_iterator<int>)__first1._M_node,
                     (_Rb_tree_const_iterator<int>)__last1._M_node,
                     (_Rb_tree_const_iterator<int>)__first2._M_node,
                     (_Rb_tree_const_iterator<int>)__last2._M_node,__result);
          bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_170);
          if (!bVar1) {
            psVar5 = std::
                     _Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
                     operator*(&local_120);
            pmVar6 = std::
                     map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                     ::at((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                           *)&__range4,psVar5);
            iVar2 = *pmVar6;
            psVar5 = std::
                     _Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
                     operator*(&local_130);
            pmVar6 = std::
                     map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                     ::at((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
                           *)&__range4,psVar5);
            OverlapGraph::addEdge
                      ((OverlapGraph *)&mapping._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       iVar2,*pmVar6);
          }
          std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_170);
          std::_Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
          operator++(&local_130);
        }
        std::_Rb_tree_const_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
        operator++(&local_120);
      }
      iVar2 = OverlapGraph::computeSupport
                        ((OverlapGraph *)&mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __range3 = (vector<int,_std::allocator<int>_> *)
                 ((long)&(__range3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + (long)iVar2);
      std::
      map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
      ::~map((map<std::set<int,_std::less<int>,_std::allocator<int>_>,_int,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::set<int,_std::less<int>,_std::allocator<int>_>,_int>_>_>
              *)&__range4);
      OverlapGraph::~OverlapGraph
                ((OverlapGraph *)&mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end0);
    }
    occurrences_local = __range3;
  }
  else {
    occurrences_local =
         (vector<int,_std::allocator<int>_> *)
         std::vector<int,_std::allocator<int>_>::size(occurrences);
  }
  return (size_t)occurrences_local;
}

Assistant:

inline size_t support(const T &occurrences,
					  const std::unordered_map<int, std::set<std::set<int>>> &multiple_occurrences,
					  bool new_measures,
					  bool heuristic_mis
	) {
	  	if (new_measures) {
		  	size_t support = 0;

			for (auto const &snapshotId : occurrences) {
		  		OverlapGraph og(heuristic_mis);
		  		std::map<std::set<int>, int> mapping;

		  		for (auto const &occurrence : multiple_occurrences.at(snapshotId)) {
					mapping[occurrence] = og.addVertex();
		  		}

			  	for (
			  		auto firstOccurrence = multiple_occurrences.at(snapshotId).begin();
			  		firstOccurrence != multiple_occurrences.at(snapshotId).end();
			  		++firstOccurrence
				) {
					for (
						auto secondOccurrence = std::next(firstOccurrence);
						secondOccurrence != multiple_occurrences.at(snapshotId).end();
						++secondOccurrence
					) {
						std::set<int> intersect;
						std::set_intersection(
							firstOccurrence->begin(), firstOccurrence->end(),
							secondOccurrence->begin(), secondOccurrence->end(),
							std::inserter(intersect,intersect.begin())
						);

						if (!intersect.empty()) {
						  	og.addEdge(mapping.at(*firstOccurrence), mapping.at(*secondOccurrence));
						}
					}
				}

			  	support += og.computeSupport();
			}

		  	return support;
		}

	  	return occurrences.size();
	}